

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

void __thiscall
rangeless::fn::impl::maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>::maybe
          (maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *this,
          maybe<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_> *other)

{
  vector<example::aln_t,_std::allocator<example::aln_t>_> *val;
  
  this->m_empty = true;
  if (other->m_empty != false) {
    return;
  }
  val = operator*(other);
  reset(this,val);
  reset(other);
  return;
}

Assistant:

maybe(maybe&& other) noexcept
        {        //^^ by value instead?
            if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            }
        }